

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

int ps_lattice_write(ps_lattice_t *dag,char *filename)

{
  ps_latnode_t *ppVar1;
  ps_latnode_t *ppVar2;
  FILE *__stream;
  latlink_list_t *local_68;
  latlink_list_t *local_58;
  latlink_list_t *l;
  char *word;
  ps_latnode_t *final;
  ps_latnode_t *initial;
  ps_latnode_t *d;
  int32 i;
  FILE *fp;
  char *filename_local;
  ps_lattice_t *dag_local;
  
  ppVar1 = dag->start;
  ppVar2 = dag->end;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,0xd9,"Writing lattice file: %s\n",filename);
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                   ,0xdb,"Failed to open lattice file \'%s\' for writing",filename);
    dag_local._4_4_ = -1;
  }
  else {
    fprintf(__stream,"# getcwd: /this/is/bogus\n");
    logmath_get_base(dag->lmath);
    fprintf(__stream,"# -logbase %e\n");
    fprintf(__stream,"#\n");
    fprintf(__stream,"Frames %d\n",(ulong)(uint)dag->n_frames);
    fprintf(__stream,"#\n");
    d._4_4_ = 0;
    for (initial = dag->nodes; initial != (ps_latnode_t *)0x0; initial = initial->next) {
      d._4_4_ = d._4_4_ + 1;
    }
    fprintf(__stream,"Nodes %d (NODEID WORD STARTFRAME FIRST-ENDFRAME LAST-ENDFRAME)\n",
            (ulong)d._4_4_);
    d._4_4_ = 0;
    for (initial = dag->nodes; initial != (ps_latnode_t *)0x0; initial = initial->next) {
      if (initial->wid < 0) {
        local_68 = (latlink_list_t *)0x0;
      }
      else {
        local_68 = (latlink_list_t *)dag->dict->word[initial->wid].word;
      }
      l = local_68;
      if (local_68 == (latlink_list_t *)0x0) {
        l = (latlink_list_t *)anon_var_dwarf_9701;
      }
      initial->id = d._4_4_;
      fprintf(__stream,"%d %s %d %d %d ; %d\n",(ulong)d._4_4_,l,(ulong)(uint)initial->sf,
              (ulong)(uint)initial->fef,initial->lef,initial->node_id);
      d._4_4_ = d._4_4_ + 1;
    }
    fprintf(__stream,"#\n");
    fprintf(__stream,"Initial %d\nFinal %d\n",(ulong)(uint)ppVar1->id,(ulong)(uint)ppVar2->id);
    fprintf(__stream,"#\n");
    fprintf(__stream,"BestSegAscr %d (NODEID ENDFRAME ASCORE)\n",0);
    fprintf(__stream,"#\n");
    fprintf(__stream,"Edges (FROM-NODEID TO-NODEID ASCORE)\n");
    for (initial = dag->nodes; initial != (ps_latnode_t *)0x0; initial = initial->next) {
      for (local_58 = initial->exits; local_58 != (latlink_list_t *)0x0; local_58 = local_58->next)
      {
        if ((-0x20000001 < local_58->link->ascr) && (local_58->link->ascr < 1)) {
          fprintf(__stream,"%d %d %d\n",(ulong)(uint)initial->id,(ulong)(uint)local_58->link->to->id
                  ,(ulong)(uint)(local_58->link->ascr << 10));
        }
      }
    }
    fprintf(__stream,"End\n");
    fclose(__stream);
    dag_local._4_4_ = 0;
  }
  return dag_local._4_4_;
}

Assistant:

int32
ps_lattice_write(ps_lattice_t *dag, char const *filename)
{
    FILE *fp;
    int32 i;
    ps_latnode_t *d, *initial, *final;

    initial = dag->start;
    final = dag->end;

    E_INFO("Writing lattice file: %s\n", filename);
    if ((fp = fopen(filename, "w")) == NULL) {
        E_ERROR_SYSTEM("Failed to open lattice file '%s' for writing", filename);
        return -1;
    }

    /* Stupid Sphinx-III lattice code expects 'getcwd:' here */
    fprintf(fp, "# getcwd: /this/is/bogus\n");
    fprintf(fp, "# -logbase %e\n", logmath_get_base(dag->lmath));
    fprintf(fp, "#\n");

    fprintf(fp, "Frames %d\n", dag->n_frames);
    fprintf(fp, "#\n");

    for (i = 0, d = dag->nodes; d; d = d->next, i++);
    fprintf(fp,
            "Nodes %d (NODEID WORD STARTFRAME FIRST-ENDFRAME LAST-ENDFRAME)\n",
            i);
    for (i = 0, d = dag->nodes; d; d = d->next, i++) {
        const char *word = dict_wordstr(dag->dict, d->wid);
        if (word == NULL)
            word = "(null)";
        d->id = i;
        fprintf(fp, "%d %s %d %d %d ; %d\n",
                i, word,
                d->sf, d->fef, d->lef, d->node_id);
    }
    fprintf(fp, "#\n");

    fprintf(fp, "Initial %d\nFinal %d\n", initial->id, final->id);
    fprintf(fp, "#\n");

    /* Don't bother with this, it's not used by anything. */
    fprintf(fp, "BestSegAscr %d (NODEID ENDFRAME ASCORE)\n",
            0 /* #BPTable entries */ );
    fprintf(fp, "#\n");

    fprintf(fp, "Edges (FROM-NODEID TO-NODEID ASCORE)\n");
    for (d = dag->nodes; d; d = d->next) {
        latlink_list_t *l;
        for (l = d->exits; l; l = l->next) {
            if (l->link->ascr WORSE_THAN WORST_SCORE || l->link->ascr BETTER_THAN 0)
                continue;
            fprintf(fp, "%d %d %d\n",
                    d->id, l->link->to->id, l->link->ascr << SENSCR_SHIFT);
        }
    }
    fprintf(fp, "End\n");
    fclose(fp);

    return 0;
}